

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectStatePdu.cpp
# Opt level: O0

void __thiscall DIS::LinearObjectStatePdu::~LinearObjectStatePdu(LinearObjectStatePdu *this)

{
  LinearObjectStatePdu *this_local;
  
  (this->super_SyntheticEnvironmentFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__LinearObjectStatePdu_002725f8;
  std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>::clear
            (&this->_linearSegmentParameters);
  std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>::~vector
            (&this->_linearSegmentParameters);
  ObjectType::~ObjectType(&this->_objectType);
  SimulationAddress::~SimulationAddress(&this->_receivingID);
  SimulationAddress::~SimulationAddress(&this->_requesterID);
  EntityID::~EntityID(&this->_referencedObjectID);
  EntityID::~EntityID(&this->_objectID);
  SyntheticEnvironmentFamilyPdu::~SyntheticEnvironmentFamilyPdu
            (&this->super_SyntheticEnvironmentFamilyPdu);
  return;
}

Assistant:

LinearObjectStatePdu::~LinearObjectStatePdu()
{
    _linearSegmentParameters.clear();
}